

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

bool fs_setenv(string_view name,string_view value)

{
  string_view path;
  int iVar1;
  const_pointer __name;
  const_pointer __value;
  string_view local_50;
  char *local_40;
  char *local_38;
  undefined1 local_30 [8];
  string_view value_local;
  string_view name_local;
  
  value_local._M_len = (size_t)value._M_str;
  local_30 = (undefined1  [8])value._M_len;
  value_local._M_str = (char *)name._M_len;
  __name = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&value_local._M_str);
  __value = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  iVar1 = setenv(__name,__value,1);
  if (iVar1 != 0) {
    local_40 = value_local._M_str;
    local_38 = name._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"fs_setenv");
    path._M_str = local_38;
    path._M_len = (size_t)local_40;
    fs_print_error(path,local_50);
  }
  name_local._M_str._7_1_ = iVar1 == 0;
  return name_local._M_str._7_1_;
}

Assistant:

bool fs_setenv(std::string_view name, std::string_view value)
{

#if defined(_WIN32)
  // SetEnvironmentVariable returned OK but set blank values
  // https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/putenv-wputenv

  if(_putenv_s(name.data(), value.data()) == 0)  FFS_LIKELY
    return true;
#else
  // https://www.man7.org/linux/man-pages/man3/setenv.3.html
  if(setenv(name.data(), value.data(), 1) == 0)  FFS_LIKELY
    return true;
#endif

  fs_print_error(name, __func__);
  return false;
}